

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

MaterialHandle
pbrt::MaterialHandle::Create
          (string *name,TextureParameterDictionary *parameters,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          *namedMaterials,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  in_RDI;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  FileLoc *in_stack_00000040;
  TextureParameterDictionary *in_stack_00000048;
  Allocator in_stack_00000050;
  iterator iter;
  int i;
  MaterialHandle materialHandles [2];
  FileLoc *in_stack_000000b0;
  TextureParameterDictionary *in_stack_000000b8;
  Allocator in_stack_000000c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materials;
  FileLoc *in_stack_000000e0;
  TextureParameterDictionary *in_stack_000000e8;
  Allocator in_stack_000000f0;
  FileLoc *in_stack_00000110;
  TextureParameterDictionary *in_stack_00000118;
  Allocator in_stack_00000120;
  MaterialHandle material;
  FileLoc *in_stack_000002a0;
  TextureParameterDictionary *in_stack_000002a8;
  Allocator in_stack_000002b0;
  FileLoc *in_stack_000003e0;
  TextureParameterDictionary *in_stack_000003e8;
  Allocator in_stack_000003f0;
  FileLoc *in_stack_00000428;
  TextureParameterDictionary *in_stack_00000430;
  Allocator in_stack_00000438;
  SubsurfaceMaterial *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  TextureParameterDictionary *in_stack_fffffffffffffe58;
  iterator in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffe88;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  this;
  _Self local_150;
  _Self local_148;
  int local_13c;
  FileLoc *in_stack_fffffffffffffec8;
  TextureParameterDictionary *in_stack_fffffffffffffed0;
  MaterialHandle *in_stack_fffffffffffffed8;
  Allocator in_stack_fffffffffffffee0;
  allocator<char> local_111;
  string local_110 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined8 local_d8;
  undefined8 local_c8;
  FileLoc *in_stack_ffffffffffffff40;
  TextureParameterDictionary *in_stack_ffffffffffffff48;
  Allocator in_stack_ffffffffffffff50;
  Allocator in_stack_ffffffffffffff58;
  Allocator in_stack_ffffffffffffff60;
  TaggedPointer local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_10;
  
  this.bits = in_RDI.bits;
  local_20 = in_RDX;
  local_10 = in_R9;
  MaterialHandle((MaterialHandle *)0x9bcae1);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48), bVar1))
  {
    TaggedPointer((MaterialHandle *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
    if (bVar1) {
      DiffuseMaterial::Create
                ((TextureParameterDictionary *)in_stack_ffffffffffffff58.memoryResource,
                 (FileLoc *)in_stack_ffffffffffffff50.memoryResource,in_stack_ffffffffffffff60);
      TaggedPointer<pbrt::DiffuseMaterial>
                ((MaterialHandle *)in_stack_fffffffffffffe50,
                 (DiffuseMaterial *)in_stack_fffffffffffffe48);
      operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                (MaterialHandle *)in_stack_fffffffffffffe48);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      if (bVar1) {
        CoatedDiffuseMaterial::Create(in_stack_000002a8,in_stack_000002a0,in_stack_000002b0);
        TaggedPointer<pbrt::CoatedDiffuseMaterial>
                  ((MaterialHandle *)in_stack_fffffffffffffe50,
                   (CoatedDiffuseMaterial *)in_stack_fffffffffffffe48);
        operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                  (MaterialHandle *)in_stack_fffffffffffffe48);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
        if (bVar1) {
          CoatedConductorMaterial::Create(in_stack_00000430,in_stack_00000428,in_stack_00000438);
          TaggedPointer<pbrt::CoatedConductorMaterial>
                    ((MaterialHandle *)in_stack_fffffffffffffe50,
                     (CoatedConductorMaterial *)in_stack_fffffffffffffe48);
          operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                    (MaterialHandle *)in_stack_fffffffffffffe48);
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
          if (bVar1) {
            DiffuseTransmissionMaterial::Create
                      (in_stack_00000048,in_stack_00000040,in_stack_00000050);
            TaggedPointer<pbrt::DiffuseTransmissionMaterial>
                      ((MaterialHandle *)in_stack_fffffffffffffe50,
                       (DiffuseTransmissionMaterial *)in_stack_fffffffffffffe48);
            operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                      (MaterialHandle *)in_stack_fffffffffffffe48);
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
            if (bVar1) {
              DielectricMaterial::Create(in_stack_000000b8,in_stack_000000b0,in_stack_000000c0);
              TaggedPointer<pbrt::DielectricMaterial>
                        ((MaterialHandle *)in_stack_fffffffffffffe50,
                         (DielectricMaterial *)in_stack_fffffffffffffe48);
              operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                        (MaterialHandle *)in_stack_fffffffffffffe48);
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
              if (bVar1) {
                ThinDielectricMaterial::Create
                          (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff50);
                TaggedPointer<pbrt::ThinDielectricMaterial>
                          ((MaterialHandle *)in_stack_fffffffffffffe50,
                           (ThinDielectricMaterial *)in_stack_fffffffffffffe48);
                operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                          (MaterialHandle *)in_stack_fffffffffffffe48);
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48)
                ;
                if (bVar1) {
                  HairMaterial::Create(in_stack_000000e8,in_stack_000000e0,in_stack_000000f0);
                  TaggedPointer<pbrt::HairMaterial>
                            ((MaterialHandle *)in_stack_fffffffffffffe50,
                             (HairMaterial *)in_stack_fffffffffffffe48);
                  operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                            (MaterialHandle *)in_stack_fffffffffffffe48);
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffe50,
                                          (char *)in_stack_fffffffffffffe48);
                  if (bVar1) {
                    ConductorMaterial::Create(in_stack_00000118,in_stack_00000110,in_stack_00000120)
                    ;
                    TaggedPointer<pbrt::ConductorMaterial>
                              ((MaterialHandle *)in_stack_fffffffffffffe50,
                               (ConductorMaterial *)in_stack_fffffffffffffe48);
                    operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                              (MaterialHandle *)in_stack_fffffffffffffe48);
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffffe50,
                                            (char *)in_stack_fffffffffffffe48);
                    if (bVar1) {
                      local_c8 = local_10;
                      MeasuredMaterial::Create
                                ((TextureParameterDictionary *)
                                 in_stack_ffffffffffffff50.memoryResource,
                                 (FileLoc *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff58);
                      TaggedPointer<pbrt::MeasuredMaterial>
                                ((MaterialHandle *)in_stack_fffffffffffffe50,
                                 (MeasuredMaterial *)in_stack_fffffffffffffe48);
                      operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                                (MaterialHandle *)in_stack_fffffffffffffe48);
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffffe50,
                                              (char *)in_stack_fffffffffffffe48);
                      if (bVar1) {
                        local_d8 = local_10;
                        SubsurfaceMaterial::Create
                                  (in_stack_000003e8,in_stack_000003e0,in_stack_000003f0);
                        TaggedPointer<pbrt::SubsurfaceMaterial>
                                  ((MaterialHandle *)in_stack_fffffffffffffe50,
                                   in_stack_fffffffffffffe48);
                        operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                                  (MaterialHandle *)in_stack_fffffffffffffe48);
                      }
                      else {
                        bVar1 = std::operator==(in_stack_fffffffffffffe50,
                                                (char *)in_stack_fffffffffffffe48);
                        if (!bVar1) {
                          ErrorExit<std::__cxx11::string_const&>
                                    ((FileLoc *)this.bits,(char *)in_stack_fffffffffffffe88,
                                     in_stack_fffffffffffffe80);
                        }
                        in_stack_fffffffffffffe88 = &local_111;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)this.bits,(char *)in_stack_fffffffffffffe88,
                                   (allocator<char> *)local_20);
                        TextureParameterDictionary::GetStringArray
                                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
                        std::__cxx11::string::~string(local_110);
                        std::allocator<char>::~allocator(&local_111);
                        sVar3 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(&local_f0);
                        if (sVar3 != 2) {
                          ErrorExit<>((char *)local_20);
                        }
                        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffec8;
                        in_stack_fffffffffffffe80 = local_20;
                        do {
                          MaterialHandle((MaterialHandle *)0x9bd0ce);
                          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)args + 8);
                        } while (args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&stack0xfffffffffffffed8);
                        for (local_13c = 0; local_13c < 2; local_13c = local_13c + 1) {
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&local_f0,(long)local_13c);
                          in_stack_fffffffffffffe60 =
                               std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                                       *)in_stack_fffffffffffffe48,(key_type *)0x9bd125);
                          local_148._M_node = in_stack_fffffffffffffe60._M_node;
                          local_150._M_node =
                               (_Base_ptr)
                               std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                                      *)in_stack_fffffffffffffe48);
                          bVar1 = std::operator==(&local_148,&local_150);
                          if (bVar1) {
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](&local_f0,(long)local_13c);
                            ErrorExit<std::__cxx11::string&>((char *)in_stack_fffffffffffffe80,args)
                            ;
                          }
                          std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>
                                        *)in_stack_fffffffffffffe50);
                          operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                                    (MaterialHandle *)in_stack_fffffffffffffe48);
                        }
                        in_stack_fffffffffffffe50 =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             MixMaterial::Create(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                                                 ,in_stack_fffffffffffffec8,
                                                 in_stack_fffffffffffffee0);
                        TaggedPointer<pbrt::MixMaterial>
                                  ((MaterialHandle *)in_stack_fffffffffffffe50,
                                   (MixMaterial *)in_stack_fffffffffffffe48);
                        operator=((MaterialHandle *)in_stack_fffffffffffffe50,
                                  (MaterialHandle *)in_stack_fffffffffffffe48);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_fffffffffffffe60._M_node);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_38);
    if (!bVar1) {
      ErrorExit<std::__cxx11::string_const&>
                ((FileLoc *)this.bits,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    }
    TextureParameterDictionary::ReportUnused((TextureParameterDictionary *)0x9bd28d);
    *(long *)(*in_FS_OFFSET + -0x88) = *(long *)(*in_FS_OFFSET + -0x88) + 1;
    MaterialHandle((MaterialHandle *)in_stack_fffffffffffffe50,
                   (MaterialHandle *)in_stack_fffffffffffffe48);
  }
  return (MaterialHandle)
         (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          )in_RDI.bits;
}

Assistant:

MaterialHandle MaterialHandle::Create(
    const std::string &name, const TextureParameterDictionary &parameters,
    /*const */ std::map<std::string, MaterialHandle> &namedMaterials, const FileLoc *loc,
    Allocator alloc) {
    MaterialHandle material;
    if (name.empty() || name == "none")
        return nullptr;
    else if (name == "diffuse")
        material = DiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coateddiffuse")
        material = CoatedDiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coatedconductor")
        material = CoatedConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "diffusetransmission")
        material = DiffuseTransmissionMaterial::Create(parameters, loc, alloc);
    else if (name == "dielectric")
        material = DielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "thindielectric")
        material = ThinDielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "hair")
        material = HairMaterial::Create(parameters, loc, alloc);
    else if (name == "conductor")
        material = ConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "measured")
        material = MeasuredMaterial::Create(parameters, loc, alloc);
    else if (name == "subsurface")
        material = SubsurfaceMaterial::Create(parameters, loc, alloc);
    else if (name == "mix") {
        std::vector<std::string> materials = parameters.GetStringArray("materials");
        if (materials.size() != 2)
            ErrorExit(
                "Must provide two values for \"string materials\" for mix material.");

        MaterialHandle materialHandles[2];
        for (int i = 0; i < 2; ++i) {
            auto iter = namedMaterials.find(materials[i]);
            if (iter == namedMaterials.end())
                ErrorExit("%s: named material not found.", materials[i]);
            materialHandles[i] = iter->second;
        }
        material = MixMaterial::Create(materialHandles, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: material type unknown.", name);

    if (!material)
        ErrorExit(loc, "%s: unable to create material.", name);

    parameters.ReportUnused();
    ++nMaterialsCreated;
    return material;
}